

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v9::vprint(FILE *f,string_view format_str,format_args args)

{
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_00;
  basic_string_view<char> fmt;
  undefined8 this;
  char *s;
  size_t count;
  unsigned_long_long uVar1;
  string_view text;
  basic_string_view<char> local_2a0;
  locale_ref local_290;
  unsigned_long_long local_288;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  aStack_280;
  char *local_278;
  size_t sStack_270;
  allocator<char> local_249;
  undefined1 local_248 [8];
  memory_buffer buffer;
  FILE *f_local;
  format_args args_local;
  string_view format_str_local;
  
  buffer._528_8_ = f;
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_248,&local_249);
  std::allocator<char>::~allocator(&local_249);
  local_288 = args.desc_;
  aStack_280 = args.field_1;
  local_278 = format_str.data_;
  sStack_270 = format_str.size_;
  detail::locale_ref::locale_ref(&local_290);
  fmt.size_ = sStack_270;
  fmt.data_ = local_278;
  args_00.field_1.args_ = aStack_280.args_;
  args_00.desc_ = local_288;
  uVar1 = local_288;
  detail::vformat_to<char>((buffer<char> *)local_248,fmt,args_00,local_290);
  this = buffer._528_8_;
  s = detail::buffer<char>::data((buffer<char> *)local_248);
  count = detail::buffer<char>::size((buffer<char> *)local_248);
  basic_string_view<char>::basic_string_view(&local_2a0,s,count);
  text.size_ = uVar1;
  text.data_ = (char *)local_2a0.size_;
  detail::print((detail *)this,(FILE *)local_2a0.data_,text);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_248);
  return;
}

Assistant:

FMT_FUNC void vprint(std::FILE* f, string_view format_str, format_args args) {
  memory_buffer buffer;
  detail::vformat_to(buffer, format_str, args);
  detail::print(f, {buffer.data(), buffer.size()});
}